

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheMove(PgHdr *p,Pgno newPgno)

{
  i16 *piVar1;
  uint uVar2;
  PCache *pPVar3;
  PgHdr *p_00;
  sqlite3_pcache_page *psVar4;
  
  pPVar3 = p->pCache;
  psVar4 = (*sqlite3Config.pcache2.xFetch)(pPVar3->pCache,newPgno,0);
  if (psVar4 != (sqlite3_pcache_page *)0x0) {
    p_00 = (PgHdr *)psVar4->pExtra;
    piVar1 = &p_00->nRef;
    *piVar1 = *piVar1 + 1;
    pPVar3->nRefSum = pPVar3->nRefSum + 1;
    sqlite3PcacheDrop(p_00);
  }
  (*sqlite3Config.pcache2.xRekey)(pPVar3->pCache,p->pPage,p->pgno,newPgno);
  p->pgno = newPgno;
  uVar2._0_2_ = p->flags;
  uVar2._2_2_ = p->nRef;
  if ((~uVar2 & 10) == 0) {
    pcacheManageDirtyList(p,'\x03');
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheMove(PgHdr *p, Pgno newPgno){
  PCache *pCache = p->pCache;
  sqlite3_pcache_page *pOther;
  assert( p->nRef>0 );
  assert( newPgno>0 );
  assert( sqlite3PcachePageSanity(p) );
  pcacheTrace(("%p.MOVE %d -> %d\n",pCache,p->pgno,newPgno));
  pOther = sqlite3GlobalConfig.pcache2.xFetch(pCache->pCache, newPgno, 0);
  if( pOther ){
    PgHdr *pXPage = (PgHdr*)pOther->pExtra;
    assert( pXPage->nRef==0 );
    pXPage->nRef++;
    pCache->nRefSum++;
    sqlite3PcacheDrop(pXPage);
  }
  sqlite3GlobalConfig.pcache2.xRekey(pCache->pCache, p->pPage, p->pgno,newPgno);
  p->pgno = newPgno;
  if( (p->flags&PGHDR_DIRTY) && (p->flags&PGHDR_NEED_SYNC) ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    assert( sqlite3PcachePageSanity(p) );
  }
}